

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O0

void __thiscall despot::LaserTag::Step(LaserTag *this)

{
  double *in_RCX;
  ACT_TYPE in_EDX;
  State *in_RSI;
  OBS_TYPE *in_R8;
  double in_XMM0_Qa;
  
  Step((LaserTag *)
       &this[-1].super_BaseTag.default_action_.super__Vector_base<int,_std::allocator<int>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage,in_RSI,in_XMM0_Qa,in_EDX,in_RCX,in_R8);
  return;
}

Assistant:

bool LaserTag::Step(State& state, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	Random random(random_num);
	bool terminal = BaseTag::Step(state, random.NextDouble(), action, reward);

	if (terminal) {
		obs = same_loc_obs_;
	} else {
		if (rob_[state.state_id] == opp_[state.state_id])
			obs = same_loc_obs_;
		else {
			const vector<vector<double> >& distribution = reading_distributions_[state.state_id];

			obs = 0;
			for (int dir = 0; dir < NBEAMS; dir++) {
				double mass = random.NextDouble();
				int reading = 0;
				for (; reading < distribution[dir].size(); reading++) {
					mass -= distribution[dir][reading];
					if (mass < Globals::TINY)
						break;
				}
				SetReading(obs, reading, dir);
			}
		}
	}

	return terminal;
}